

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

char ON_String::MapCharacterOrdinal(ON_StringMapOrdinalType map_type,char c)

{
  char c_local;
  ON_StringMapOrdinalType map_type_local;
  
  if (map_type != UpperOrdinal) {
    if (map_type == LowerOrdinal) {
      if (c < 'A') {
        return c;
      }
      if ('Z' < c) {
        return c;
      }
      return c + ' ';
    }
    if (map_type != MinimumOrdinal) {
      return c;
    }
  }
  c_local = c;
  if (('`' < c) && (c < '{')) {
    c_local = c + -0x20;
  }
  return c_local;
}

Assistant:

char ON_String::MapCharacterOrdinal(
  ON_StringMapOrdinalType map_type,
  char c
  )
{
  switch (map_type)
  {
  case ON_StringMapOrdinalType::UpperOrdinal:
  case ON_StringMapOrdinalType::MinimumOrdinal:
    if (c >= 'a' && c <= 'z')
      return c - 0x20;
    break;
  case ON_StringMapOrdinalType::LowerOrdinal:
    if (c >= 'A' && c <= 'Z')
      return c + 0x20;
    break;
  default:
    break;
  }

  return c;
}